

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_log.cpp
# Opt level: O2

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> __thiscall
duckdb::WriteLogBind
          (duckdb *this,ClientContext *context,ScalarFunction *bound_function,
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
          *arguments)

{
  bool bVar1;
  char cVar2;
  LogLevel LVar3;
  reference pvVar4;
  pointer pEVar5;
  type pEVar6;
  pointer pWVar7;
  string *value;
  ParameterNotResolvedException *this_00;
  BinderException *pBVar8;
  InvalidTypeException *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params;
  ulong __n;
  allocator local_c9;
  _Head_base<0UL,_duckdb::WriteLogBindData_*,_false> local_c8;
  Value local_c0;
  __uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_> local_80;
  LogicalType *local_78;
  string local_70;
  string local_50 [32];
  
  local_80._M_t.
  super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>.
  super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl =
       (tuple<duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>)
       (tuple<duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>)this;
  if ((arguments->
      super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ).
      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (arguments->
      super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ).
      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pBVar8 = (BinderException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&local_c0,"write_log takes at least one argument",(allocator *)&local_c8);
    BinderException::BinderException(pBVar8,(string *)&local_c0);
    __cxa_throw(pBVar8,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
  }
  pvVar4 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
           ::get<true>(arguments,0);
  pEVar5 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     (pvVar4);
  LogicalType::LogicalType(&local_c0.type_,VARCHAR);
  bVar1 = LogicalType::operator!=(&pEVar5->return_type,&local_c0.type_);
  LogicalType::~LogicalType(&local_c0.type_);
  if (bVar1) {
    this_01 = (InvalidTypeException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&local_c0,"write_log first argument must be a VARCHAR",
               (allocator *)&local_c8);
    InvalidTypeException::InvalidTypeException(this_01,(string *)&local_c0);
    __cxa_throw(this_01,&InvalidTypeException::typeinfo,::std::runtime_error::~runtime_error);
  }
  make_uniq<duckdb::WriteLogBindData>();
  LogicalType::LogicalType(&local_c0.type_,VARCHAR);
  local_78 = &(bound_function->super_BaseScalarFunction).return_type;
  LogicalType::operator=(local_78,&local_c0.type_);
  LogicalType::~LogicalType(&local_c0.type_);
  __n = 1;
  do {
    if ((ulong)((long)(arguments->
                      super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                      ).
                      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(arguments->
                      super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                      ).
                      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3) <= __n) {
      pWVar7 = unique_ptr<duckdb::WriteLogBindData,_std::default_delete<duckdb::WriteLogBindData>,_true>
               ::operator->((unique_ptr<duckdb::WriteLogBindData,_std::default_delete<duckdb::WriteLogBindData>,_true>
                             *)&local_c8);
      (pWVar7->context).ptr = context;
      *(WriteLogBindData **)
       local_80._M_t.
       super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>.
       super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl = local_c8._M_head_impl;
      return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
             (_Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>)
             local_80._M_t.
             super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>
             .super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl;
    }
    pvVar4 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
             ::get<true>(arguments,__n);
    pEVar5 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->(pvVar4);
    params = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             (pEVar5->super_BaseExpression)._vptr_BaseExpression;
    cVar2 = (*(code *)params[1].field_2._M_allocated_capacity)(pEVar5);
    if (cVar2 != '\0') {
      this_00 = (ParameterNotResolvedException *)__cxa_allocate_exception(0x10);
      ParameterNotResolvedException::ParameterNotResolvedException(this_00);
      __cxa_throw(this_00,&ParameterNotResolvedException::typeinfo,
                  ::std::runtime_error::~runtime_error);
    }
    pEVar5 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->(pvVar4);
    bVar1 = ::std::operator==(&(pEVar5->super_BaseExpression).alias,"disable_logging");
    if (bVar1) {
      pEVar6 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator*(pvVar4);
      ThrowIfNotConstant(pEVar6);
      pEVar5 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator->(pvVar4);
      if ((pEVar5->return_type).id_ != BOOLEAN) {
        pBVar8 = (BinderException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&local_c0,"write_log: \'disable_logging\' argument must be a boolean",
                   &local_c9);
        BinderException::BinderException(pBVar8,(string *)&local_c0);
        __cxa_throw(pBVar8,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
      }
      pEVar6 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator*(pvVar4);
      ExpressionExecutor::EvaluateScalar(&local_c0,context,pEVar6,false);
      bVar1 = BooleanValue::Get(&local_c0);
      pWVar7 = unique_ptr<duckdb::WriteLogBindData,_std::default_delete<duckdb::WriteLogBindData>,_true>
               ::operator->((unique_ptr<duckdb::WriteLogBindData,_std::default_delete<duckdb::WriteLogBindData>,_true>
                             *)&local_c8);
      pWVar7->disable_logging = bVar1;
LAB_0186f0de:
      Value::~Value(&local_c0);
    }
    else {
      pEVar5 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator->(pvVar4);
      bVar1 = ::std::operator==(&(pEVar5->super_BaseExpression).alias,"scope");
      if (bVar1) {
        pEVar6 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                 operator*(pvVar4);
        ThrowIfNotConstant(pEVar6);
        pEVar5 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                 operator->(pvVar4);
        if ((pEVar5->return_type).id_ != VARCHAR) {
          pBVar8 = (BinderException *)__cxa_allocate_exception(0x10);
          ::std::__cxx11::string::string
                    ((string *)&local_c0,"write_log: \'scope\' argument must be a string",&local_c9)
          ;
          BinderException::BinderException(pBVar8,(string *)&local_c0);
          __cxa_throw(pBVar8,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
        }
        pEVar6 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                 operator*(pvVar4);
        ExpressionExecutor::EvaluateScalar(&local_c0,context,pEVar6,false);
        StringValue::Get_abi_cxx11_(&local_c0);
        pWVar7 = unique_ptr<duckdb::WriteLogBindData,_std::default_delete<duckdb::WriteLogBindData>,_true>
                 ::operator->((unique_ptr<duckdb::WriteLogBindData,_std::default_delete<duckdb::WriteLogBindData>,_true>
                               *)&local_c8);
        ::std::__cxx11::string::_M_assign((string *)&pWVar7->scope);
        goto LAB_0186f0de;
      }
      pEVar5 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator->(pvVar4);
      bVar1 = ::std::operator==(&(pEVar5->super_BaseExpression).alias,"level");
      if (bVar1) {
        pEVar6 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                 operator*(pvVar4);
        ThrowIfNotConstant(pEVar6);
        pEVar5 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                 operator->(pvVar4);
        if ((pEVar5->return_type).id_ != VARCHAR) {
          pBVar8 = (BinderException *)__cxa_allocate_exception(0x10);
          ::std::__cxx11::string::string
                    ((string *)&local_c0,"write_log: \'level\' argument must be a string",&local_c9)
          ;
          BinderException::BinderException(pBVar8,(string *)&local_c0);
          __cxa_throw(pBVar8,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
        }
        pEVar6 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                 operator*(pvVar4);
        ExpressionExecutor::EvaluateScalar(&local_c0,context,pEVar6,false);
        value = StringValue::Get_abi_cxx11_(&local_c0);
        LVar3 = EnumUtil::FromString<duckdb::LogLevel>(value);
        pWVar7 = unique_ptr<duckdb::WriteLogBindData,_std::default_delete<duckdb::WriteLogBindData>,_true>
                 ::operator->((unique_ptr<duckdb::WriteLogBindData,_std::default_delete<duckdb::WriteLogBindData>,_true>
                               *)&local_c8);
        pWVar7->level = LVar3;
        goto LAB_0186f0de;
      }
      pEVar5 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator->(pvVar4);
      bVar1 = ::std::operator==(&(pEVar5->super_BaseExpression).alias,"log_type");
      if (bVar1) {
        pEVar6 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                 operator*(pvVar4);
        ThrowIfNotConstant(pEVar6);
        pEVar5 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                 operator->(pvVar4);
        if ((pEVar5->return_type).id_ != VARCHAR) {
          pBVar8 = (BinderException *)__cxa_allocate_exception(0x10);
          ::std::__cxx11::string::string
                    ((string *)&local_c0,"write_log: \'log_type\' argument must be a string",
                     &local_c9);
          BinderException::BinderException(pBVar8,(string *)&local_c0);
          __cxa_throw(pBVar8,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
        }
        pEVar6 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                 operator*(pvVar4);
        ExpressionExecutor::EvaluateScalar(&local_c0,context,pEVar6,false);
        StringValue::Get_abi_cxx11_(&local_c0);
        pWVar7 = unique_ptr<duckdb::WriteLogBindData,_std::default_delete<duckdb::WriteLogBindData>,_true>
                 ::operator->((unique_ptr<duckdb::WriteLogBindData,_std::default_delete<duckdb::WriteLogBindData>,_true>
                               *)&local_c8);
        ::std::__cxx11::string::_M_assign((string *)&pWVar7->type);
        goto LAB_0186f0de;
      }
      pEVar5 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator->(pvVar4);
      bVar1 = ::std::operator==(&(pEVar5->super_BaseExpression).alias,"return_value");
      if (!bVar1) {
        pBVar8 = (BinderException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string(local_50,"write_log: Unknown argument \'%s\'",&local_c9);
        pEVar5 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                 operator->(pvVar4);
        ::std::__cxx11::string::string
                  ((string *)&local_70,(string *)&(pEVar5->super_BaseExpression).alias);
        StringUtil::Format<std::__cxx11::string>
                  ((string *)&local_c0,(StringUtil *)local_50,&local_70,params);
        BinderException::BinderException(pBVar8,(string *)&local_c0);
        __cxa_throw(pBVar8,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
      }
      pEVar5 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator->(pvVar4);
      pWVar7 = unique_ptr<duckdb::WriteLogBindData,_std::default_delete<duckdb::WriteLogBindData>,_true>
               ::operator->((unique_ptr<duckdb::WriteLogBindData,_std::default_delete<duckdb::WriteLogBindData>,_true>
                             *)&local_c8);
      LogicalType::operator=(&pWVar7->return_type,&pEVar5->return_type);
      pWVar7 = unique_ptr<duckdb::WriteLogBindData,_std::default_delete<duckdb::WriteLogBindData>,_true>
               ::operator->((unique_ptr<duckdb::WriteLogBindData,_std::default_delete<duckdb::WriteLogBindData>,_true>
                             *)&local_c8);
      pWVar7->output_col = __n;
      pWVar7 = unique_ptr<duckdb::WriteLogBindData,_std::default_delete<duckdb::WriteLogBindData>,_true>
               ::operator->((unique_ptr<duckdb::WriteLogBindData,_std::default_delete<duckdb::WriteLogBindData>,_true>
                             *)&local_c8);
      LogicalType::operator=(local_78,&pWVar7->return_type);
    }
    __n = __n + 1;
  } while( true );
}

Assistant:

unique_ptr<FunctionData> WriteLogBind(ClientContext &context, ScalarFunction &bound_function,
                                      vector<unique_ptr<Expression>> &arguments) {
	if (arguments.empty()) {
		throw BinderException("write_log takes at least one argument");
	}

	if (arguments[0]->return_type != LogicalType::VARCHAR) {
		throw InvalidTypeException("write_log first argument must be a VARCHAR");
	}

	// Used to replace the actual log call with a nop: useful for benchmarking
	auto result = make_uniq<WriteLogBindData>();

	// Default return type
	bound_function.return_type = LogicalType::VARCHAR;

	for (idx_t i = 1; i < arguments.size(); i++) {
		auto &arg = arguments[i];
		if (arg->HasParameter()) {
			throw ParameterNotResolvedException();
		}
		if (arg->alias == "disable_logging") {
			ThrowIfNotConstant(*arg);
			if (arg->return_type.id() != LogicalTypeId::BOOLEAN) {
				throw BinderException("write_log: 'disable_logging' argument must be a boolean");
			}
			result->disable_logging = BooleanValue::Get(ExpressionExecutor::EvaluateScalar(context, *arg));
		} else if (arg->alias == "scope") {
			ThrowIfNotConstant(*arg);
			if (arg->return_type.id() != LogicalTypeId::VARCHAR) {
				throw BinderException("write_log: 'scope' argument must be a string");
			}
			result->scope = StringValue::Get(ExpressionExecutor::EvaluateScalar(context, *arg));
		} else if (arg->alias == "level") {
			ThrowIfNotConstant(*arg);
			if (arg->return_type.id() != LogicalTypeId::VARCHAR) {
				throw BinderException("write_log: 'level' argument must be a string");
			}
			result->level =
			    EnumUtil::FromString<LogLevel>(StringValue::Get(ExpressionExecutor::EvaluateScalar(context, *arg)));
		} else if (arg->alias == "log_type") {
			ThrowIfNotConstant(*arg);
			if (arg->return_type.id() != LogicalTypeId::VARCHAR) {
				throw BinderException("write_log: 'log_type' argument must be a string");
			}
			result->type = StringValue::Get(ExpressionExecutor::EvaluateScalar(context, *arg));
		} else if (arg->alias == "return_value") {
			result->return_type = arg->return_type;
			result->output_col = i;
			bound_function.return_type = result->return_type;
		} else {
			throw BinderException(StringUtil::Format("write_log: Unknown argument '%s'", arg->alias));
		}
	}

	result->context = context;

	return std::move(result);
}